

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O1

void __thiscall CVmObjDict::create_hash_table(CVmObjDict *this)

{
  uint uVar1;
  undefined4 uVar2;
  CVmObjPageEntry *pCVar3;
  CVmHashTable *pCVar4;
  vmdict_TrieNode *this_00;
  char *pcVar5;
  int iVar6;
  undefined8 *puVar7;
  CVmHashTable *this_01;
  
  uVar1 = *(uint *)((this->super_CVmObject).ext_ + 0x20);
  if (uVar1 == 0) {
    puVar7 = (undefined8 *)operator_new(8);
    *puVar7 = &PTR__CVmHashFunc_0036d8b8;
  }
  else {
    iVar6 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[uVar1 >> 0xc] + (uVar1 & 0xfff),
                       CVmObjStrComp::metaclass_reg_);
    if (iVar6 == 0) {
      puVar7 = (undefined8 *)operator_new(0x18);
      uVar2 = *(undefined4 *)((this->super_CVmObject).ext_ + 0x20);
      *puVar7 = &PTR__CVmHashFunc_0036ac08;
      puVar7[2] = 0;
      *(undefined4 *)(puVar7 + 1) = uVar2;
    }
    else {
      puVar7 = (undefined8 *)operator_new(0x10);
      uVar1 = *(uint *)((this->super_CVmObject).ext_ + 0x20);
      pCVar3 = G_obj_table_X.pages_[uVar1 >> 0xc];
      *puVar7 = &PTR__CVmHashFunc_0036abb8;
      puVar7[1] = (pCVar3->ptr_).obj_ + (uVar1 & 0xfff) * 0x18;
    }
  }
  this_01 = (CVmHashTable *)operator_new(0x20);
  CVmHashTable::init(this_01,(EVP_PKEY_CTX *)0x100);
  pCVar4 = *(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10);
  if (pCVar4 != (CVmHashTable *)0x0) {
    CVmHashTable::move_entries_to(pCVar4,this_01);
    pCVar4 = *(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10);
    if (pCVar4 != (CVmHashTable *)0x0) {
      CVmHashTable::~CVmHashTable(pCVar4);
      operator_delete(pCVar4,0x20);
    }
  }
  this_00 = *(vmdict_TrieNode **)((this->super_CVmObject).ext_ + 0x38);
  if (this_00 != (vmdict_TrieNode *)0x0) {
    vmdict_TrieNode::~vmdict_TrieNode(this_00);
    operator_delete(this_00,0x18);
    pcVar5 = (this->super_CVmObject).ext_;
    pcVar5[0x38] = '\0';
    pcVar5[0x39] = '\0';
    pcVar5[0x3a] = '\0';
    pcVar5[0x3b] = '\0';
    pcVar5[0x3c] = '\0';
    pcVar5[0x3d] = '\0';
    pcVar5[0x3e] = '\0';
    pcVar5[0x3f] = '\0';
  }
  *(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10) = this_01;
  return;
}

Assistant:

void CVmObjDict::create_hash_table(VMG0_)
{
    CVmHashTable *new_tab;
    CVmHashFunc *hash_func;
    
    /*
     *   Create our hash function.  If we have a comparator object, base the
     *   hash function on the comparator; use a special hash function if we
     *   specifically have a StringComparator, since we can call these
     *   directly for better efficiency.  If we have no comparator, create a
     *   generic exact string match hash function.  
     */
    if (get_ext()->comparator_ != VM_INVALID_OBJ)
    {
        /* 
         *   use our special StringComparator hash function if possible;
         *   otherwise, use a generic comparator hash function 
         */
        if (CVmObjStrComp::is_strcmp_obj(vmg_ get_ext()->comparator_))
        {
            /* create a StringComparator hash function */
            hash_func = new CVmHashFuncStrComp(
                (CVmObjStrComp *)vm_objp(vmg_ get_ext()->comparator_));
        }
        else
        {
            /* create a generic comparator hash function */
            hash_func = new CVmHashFuncComparator(
                vmg_ get_ext()->comparator_);
        }
    }